

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O2

void __thiscall Dependency::Dependency(Dependency *this,string *path,string *dependent_file)

{
  string *this_00;
  string *this_01;
  bool bVar1;
  __type _Var2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  pointer __lhs;
  pointer pbVar6;
  string framework_root;
  string framework_path;
  string original_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  string framework_name;
  string local_1078;
  string warning_msg;
  char buffer [4096];
  
  this->is_framework = false;
  this_00 = &this->filename;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  this_01 = &this->prefix;
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_name)._M_dataplus._M_p = (pointer)&(this->new_name).field_2;
  (this->new_name)._M_string_length = 0;
  (this->new_name).field_2._M_local_buf[0] = '\0';
  rtrim_in_place(path);
  original_file._M_dataplus._M_p = (pointer)&original_file.field_2;
  original_file._M_string_length = 0;
  original_file.field_2._M_local_buf[0] = '\0';
  warning_msg._M_dataplus._M_p = (pointer)&warning_msg.field_2;
  warning_msg._M_string_length = 0;
  warning_msg.field_2._M_local_buf[0] = '\0';
  bVar1 = isRpath(path);
  if (bVar1) {
    searchFilenameInRpaths(&framework_root,path,dependent_file);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&original_file,&framework_root);
    std::__cxx11::string::~string((string *)&framework_root);
  }
  else {
    pcVar3 = realpath((path->_M_dataplus)._M_p,buffer);
    if (pcVar3 == (char *)0x0) {
      std::operator+(&framework_path,"\n/!\\ WARNING: Cannot resolve path \'",path);
      std::operator+(&framework_root,&framework_path,"\'\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&warning_msg,&framework_root);
      std::__cxx11::string::~string((string *)&framework_root);
      std::__cxx11::string::~string((string *)&framework_path);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&original_file,path);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&original_file,buffer);
    }
  }
  bVar1 = Settings::verboseOutput();
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"** Dependency ctor **");
    std::endl<char,std::char_traits<char>>(poVar4);
    _Var2 = std::operator==(path,dependent_file);
    if (!_Var2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"  dependent file:  ");
      poVar4 = std::operator<<(poVar4,(string *)dependent_file);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"  dependency path: ");
    poVar4 = std::operator<<(poVar4,(string *)path);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"  original_file:   ");
    poVar4 = std::operator<<(poVar4,(string *)&original_file);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  _Var2 = std::operator==(&original_file,path);
  if (!_Var2) {
    AddSymlink(this,path);
  }
  filePrefix(&framework_root,&original_file);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_01,&framework_root);
  std::__cxx11::string::~string((string *)&framework_root);
  stripPrefix(&framework_root,&original_file);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,&framework_root);
  std::__cxx11::string::~string((string *)&framework_root);
  sVar5 = (this->prefix)._M_string_length;
  if ((sVar5 != 0) && ((this_01->_M_dataplus)._M_p[sVar5 - 1] != '/')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_01,"/");
  }
  bVar1 = Settings::isPrefixBundled(this_01);
  if (!bVar1) goto LAB_00106186;
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&original_file,".framework",0);
  if (sVar5 != 0xffffffffffffffff) {
    this->is_framework = true;
    getFrameworkRoot(&framework_root,&original_file);
    getFrameworkPath(&framework_path,&original_file);
    stripPrefix(&framework_name,&framework_root);
    filePrefix(&local_1078,&framework_root);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,&local_1078);
    std::__cxx11::string::~string((string *)&local_1078);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &search_paths,&framework_name,"/");
    std::operator+(&local_1078,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &search_paths,&framework_path);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_1078);
    std::__cxx11::string::~string((string *)&local_1078);
    std::__cxx11::string::~string((string *)&search_paths);
    bVar1 = Settings::verboseOutput();
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"  framework root: ");
      poVar4 = std::operator<<(poVar4,(string *)&framework_root);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  framework path: ");
      poVar4 = std::operator<<(poVar4,(string *)&framework_path);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  framework name: ");
      poVar4 = std::operator<<(poVar4,(string *)&framework_name);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::__cxx11::string::~string((string *)&framework_name);
    std::__cxx11::string::~string((string *)&framework_path);
    std::__cxx11::string::~string((string *)&framework_root);
  }
  if ((this->prefix)._M_string_length == 0) {
LAB_00105f11:
    Settings::searchPaths_abi_cxx11_();
    __lhs = search_paths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = search_paths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (search_paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        search_paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      initSearchPaths();
      __lhs = search_paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = search_paths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; __lhs != pbVar6; __lhs = __lhs + 1) {
      std::operator+(&framework_root,__lhs,this_00);
      bVar1 = fileExists(&framework_root);
      std::__cxx11::string::~string((string *)&framework_root);
      if (bVar1) {
        std::operator+(&local_1078,"FOUND ",this_00);
        std::operator+(&framework_name,&local_1078," in ");
        std::operator+(&framework_path,&framework_name,__lhs);
        std::operator+(&framework_root,&framework_path,"\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&warning_msg,&framework_root);
        std::__cxx11::string::~string((string *)&framework_root);
        std::__cxx11::string::~string((string *)&framework_path);
        std::__cxx11::string::~string((string *)&framework_name);
        std::__cxx11::string::~string((string *)&local_1078);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_01,__lhs);
        Settings::missingPrefixes(true);
        break;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&search_paths);
  }
  else {
    std::operator+(&framework_root,this_01,this_00);
    bVar1 = fileExists(&framework_root);
    std::__cxx11::string::~string((string *)&framework_root);
    if (!bVar1) goto LAB_00105f11;
  }
  bVar1 = Settings::quietOutput();
  if (!bVar1) {
    std::operator<<((ostream *)&std::cout,(string *)&warning_msg);
  }
  bVar1 = Settings::isPrefixIgnored(this_01);
  if (!bVar1) {
    if ((this->prefix)._M_string_length != 0) {
      std::operator+(&framework_root,this_01,this_00);
      bVar1 = fileExists(&framework_root);
      std::__cxx11::string::~string((string *)&framework_root);
      if (bVar1) goto LAB_00106179;
    }
    bVar1 = Settings::quietOutput();
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"\n/!\\ WARNING: Dependency ");
      poVar4 = std::operator<<(poVar4,(string *)this_00);
      poVar4 = std::operator<<(poVar4," of ");
      poVar4 = std::operator<<(poVar4,(string *)dependent_file);
      std::operator<<(poVar4," not found\n");
    }
    bVar1 = Settings::verboseOutput();
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"     path: ");
      std::operator+(&framework_root,this_01,this_00);
      poVar4 = std::operator<<(poVar4,(string *)&framework_root);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&framework_root);
    }
    Settings::missingPrefixes(true);
    getUserInputDirForFile(&framework_root,this_00,dependent_file);
    Settings::addSearchPath(&framework_root);
    std::__cxx11::string::~string((string *)&framework_root);
  }
LAB_00106179:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->new_name,this_00);
LAB_00106186:
  std::__cxx11::string::~string((string *)&warning_msg);
  std::__cxx11::string::~string((string *)&original_file);
  return;
}

Assistant:

Dependency::Dependency(string path, const string& dependent_file)
    : is_framework(false)
{
    char buffer[PATH_MAX];
    rtrim_in_place(path);
    string original_file;
    string warning_msg;

    if (isRpath(path))
    {
        original_file = searchFilenameInRpaths(path, dependent_file);
    }
    else if (realpath(path.c_str(), buffer))
    {
        original_file = buffer;
    }
    else
    {
        warning_msg = "\n/!\\ WARNING: Cannot resolve path '" + path + "'\n";
        original_file = path;
    }

    if (Settings::verboseOutput())
    {
        cout << "** Dependency ctor **" << endl;
        if (path != dependent_file)
            cout << "  dependent file:  " << dependent_file << endl;
        cout << "  dependency path: " << path << endl;
        cout << "  original_file:   " << original_file << endl;
    }

    // check if given path is a symlink
    if (original_file != path)
        AddSymlink(path);

    prefix = filePrefix(original_file);
    filename = stripPrefix(original_file);

    if (!prefix.empty() && prefix[prefix.size()-1] != '/')
        prefix += "/";

    // check if this dependency is in /usr/lib, /System/Library, or in ignored list
    if (!Settings::isPrefixBundled(prefix))
        return;

    if (original_file.find(".framework") != string::npos)
    {
        is_framework = true;
        string framework_root = getFrameworkRoot(original_file);
        string framework_path = getFrameworkPath(original_file);
        string framework_name = stripPrefix(framework_root);
        prefix = filePrefix(framework_root);
        filename = framework_name + "/" + framework_path;
        if (Settings::verboseOutput())
        {
            cout << "  framework root: " << framework_root << endl;
            cout << "  framework path: " << framework_path << endl;
            cout << "  framework name: " << framework_name << endl;
        }
    }

    // check if the lib is in a known location
    if (prefix.empty() || !fileExists(prefix+filename))
    {
        vector<string> search_paths = Settings::searchPaths();
        if (search_paths.empty())
            initSearchPaths();
        // check if file is contained in one of the paths
        for (const auto& search_path : search_paths)
        {
            if (fileExists(search_path+filename))
            {
                warning_msg += "FOUND " + filename + " in " + search_path + "\n";
                prefix = search_path;
                Settings::missingPrefixes(true);
                break;
            }
        }
    }

    if (!Settings::quietOutput())
        cout << warning_msg;

    // if the location is still unknown, ask the user for search path
    if (!Settings::isPrefixIgnored(prefix) && (prefix.empty() || !fileExists(prefix+filename)))
    {
        if (!Settings::quietOutput())
            cerr << "\n/!\\ WARNING: Dependency " << filename << " of " << dependent_file << " not found\n";
        if (Settings::verboseOutput())
            cout << "     path: " << (prefix+filename) << endl;
        Settings::missingPrefixes(true);
        Settings::addSearchPath(getUserInputDirForFile(filename, dependent_file));
    }
    new_name = filename;
}